

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

int check_func_args(char *func_name)

{
  char *__format;
  char string [64];
  char acStack_58 [72];
  
  if (expr_lablcnt == 0) {
    __format = "No symbol in function %s!";
  }
  else {
    if (expr_lablcnt == 1) {
      return 1;
    }
    __format = "Too many symbols in function %s!";
  }
  sprintf(acStack_58,__format,func_name);
  error(acStack_58);
  return 0;
}

Assistant:

int
check_func_args(char *func_name)
{
	char string[64];

	if (expr_lablcnt == 1)
		return (1);
	else if (expr_lablcnt == 0)
		sprintf(string, "No symbol in function %s!", func_name);
	else {
		sprintf(string, "Too many symbols in function %s!", func_name);
	}

	/* output message */
	error(string);
	return (0);
}